

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O1

void __thiscall
TPZCompElDisc::SolutionXInternal<double>(TPZCompElDisc *this,TPZVec<double> *x,TPZVec<double> *uh)

{
  uint uVar1;
  TNode *pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TPZCompMesh *pTVar6;
  long *plVar7;
  TPZFMatrix<double> *pTVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  TPZFMatrix<double> phix;
  TPZFMatrix<double> dphix;
  double local_158;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  pTVar6 = TPZCompEl::Mesh((TPZCompEl *)this);
  plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  iVar3 = (**(code **)(*plVar7 + 0x78))(plVar7);
  pTVar8 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar6->fSolution);
  iVar4 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 600))(this);
  iVar5 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))(this);
  lVar9 = (long)iVar4;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar4 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar11 = lVar9 * 8;
    }
    local_150.fElem = (double *)operator_new__(uVar11);
    if (0 < iVar4) {
      memset(local_150.fElem,0,lVar9 * 8);
    }
  }
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)iVar5;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar11 = iVar5 * lVar9;
  if (uVar11 != 0) {
    local_c0.fElem = (double *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
    if (0 < (long)uVar11) {
      memset(local_c0.fElem,0,uVar11 * 8);
    }
  }
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x330))
            (this,x,&local_150,&local_c0);
  lVar9 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                    (this,0);
  pTVar2 = (pTVar6->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
  uVar1 = pTVar2[*(int *)(lVar9 + 8)].dim;
  uVar11 = (ulong)uVar1;
  lVar9 = (long)pTVar2[*(int *)(lVar9 + 8)].pos;
  local_158 = 0.0;
  TPZVec<double>::Fill(uh,&local_158,0,-1);
  if (0 < (int)uVar1) {
    iVar4 = 0;
    do {
      iVar5 = iVar4 / iVar3;
      uVar10 = (long)iVar4 % (long)iVar3 & 0xffffffff;
      if (((iVar5 < 0) || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= iVar5)) ||
         (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((lVar9 < 0) || ((pTVar8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((pTVar8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      uh->fStore[uVar10] = local_150.fElem[iVar5] * pTVar8->fElem[lVar9] + uh->fStore[uVar10];
      iVar4 = iVar4 + 1;
      lVar9 = lVar9 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZCompElDisc::SolutionXInternal(TPZVec<REAL> &x, TPZVec<TVar> &uh){
	TPZCompMesh *finemesh = Mesh();
	TPZBlock &fineblock = finemesh->Block();
	int nstate = Material()->NStateVariables();
	TPZFMatrix<TVar> &FineMeshSol = finemesh->Solution();
	int matsize = NShapeF(),dim = Dimension();
	TPZFMatrix<REAL> phix(matsize,1,0.);
	TPZFMatrix<REAL> dphix(dim,matsize,0.);
	ShapeX(x,phix,dphix);
	TPZConnect *df = &Connect(0);
	int64_t dfseq = df->SequenceNumber();
	int dfvar = fineblock.Size(dfseq);
	int64_t pos   = fineblock.Position(dfseq);
	int iv = 0,d;
	uh.Fill(0.);
	for(d=0; d<dfvar; d++) {
		uh[iv%nstate] += (TVar)phix(iv/nstate,0)*FineMeshSol(pos+d,0);
		iv++;
	}
}